

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

btBroadphaseProxy * __thiscall
btAxisSweep3Internal<unsigned_short>::createProxy
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          int shapeType,void *userPtr,short collisionFilterGroup,short collisionFilterMask,
          btDispatcher *dispatcher,void *multiSapProxy)

{
  unsigned_short index;
  int iVar1;
  Handle *pHVar2;
  undefined4 extraout_var;
  uint in_ECX;
  undefined8 in_RDX;
  btVector3 *unaff_RBX;
  void *in_RSI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  undefined8 in_R8;
  short in_R9W;
  btAxisSweep3Internal<unsigned_short> *unaff_retaddr;
  short in_stack_00000008;
  btDispatcher *in_stack_00000010;
  void *in_stack_00000018;
  btBroadphaseProxy *rayProxy;
  Handle *handle;
  unsigned_short handleId;
  btDispatcher *pbVar3;
  undefined4 uVar4;
  
  pbVar3 = in_stack_00000010;
  index = addHandle(unaff_retaddr,unaff_RBX,(btVector3 *)in_RDI,in_RSI,
                    (short)((ulong)in_RDX >> 0x30),(short)((ulong)in_RDX >> 0x20),in_stack_00000010,
                    in_stack_00000018);
  uVar4 = (undefined4)((ulong)pbVar3 >> 0x20);
  pHVar2 = getHandle(in_RDI,index);
  if (in_RDI->m_raycastAccelerator != (btDbvtBroadphase *)0x0) {
    iVar1 = (*(in_RDI->m_raycastAccelerator->super_btBroadphaseInterface).
              _vptr_btBroadphaseInterface[2])
                      (in_RDI->m_raycastAccelerator,in_RSI,in_RDX,(ulong)in_ECX,in_R8,
                       (ulong)(uint)(int)in_R9W,CONCAT44(uVar4,(int)in_stack_00000008),
                       in_stack_00000010,0);
    pHVar2->m_dbvtProxy = (btBroadphaseProxy *)CONCAT44(extraout_var,iVar1);
  }
  return &pHVar2->super_btBroadphaseProxy;
}

Assistant:

btBroadphaseProxy*	btAxisSweep3Internal<BP_FP_INT_TYPE>::createProxy(  const btVector3& aabbMin,  const btVector3& aabbMax,int shapeType,void* userPtr,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
		(void)shapeType;
		BP_FP_INT_TYPE handleId = addHandle(aabbMin,aabbMax, userPtr,collisionFilterGroup,collisionFilterMask,dispatcher,multiSapProxy);
		
		Handle* handle = getHandle(handleId);
		
		if (m_raycastAccelerator)
		{
			btBroadphaseProxy* rayProxy = m_raycastAccelerator->createProxy(aabbMin,aabbMax,shapeType,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher,0);
			handle->m_dbvtProxy = rayProxy;
		}
		return handle;
}